

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_x_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined2 uVar24;
  undefined8 uVar25;
  undefined2 uVar26;
  undefined2 uVar27;
  undefined2 uVar28;
  ulong uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  longlong lVar33;
  longlong lVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  int in_ECX;
  int iVar37;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  int iVar39;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  int iVar40;
  int iVar41;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar38 [16];
  long in_stack_00000008;
  int *in_stack_00000018;
  __m128i res_16b_3;
  __m128i res_clip_1;
  __m128i res_16b_2;
  __m128i round_result_hi;
  __m128i round_result_lo;
  __m128i comp_avg_res_hi;
  __m128i comp_avg_res_lo;
  __m128i data_ref_0_hi;
  __m128i data_ref_0_lo;
  __m128i data_0_1;
  __m128i res_unsigned_hi;
  __m128i res2;
  __m128i res_16b_1;
  __m128i res_clip;
  __m128i res_16b;
  __m128i round_result;
  __m128i comp_avg_res;
  __m128i data_ref_0;
  __m128i data_0;
  __m128i res_unsigned_lo;
  __m128i res1;
  __m128i res_odd;
  __m128i res_even;
  __m128i row01;
  __m128i row00;
  __m128i clip_pixel_to_bd;
  __m128i rounding_const;
  int rounding_shift;
  __m128i offset_const;
  int offset;
  int offset_0;
  __m128i round_shift_bits;
  __m128i round_shift_x;
  __m128i round_const_x;
  __m128i zero;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m128i coeffs_x [4];
  __m128i s [4];
  int j;
  int i;
  int bits;
  uint16_t *src_ptr;
  int fo_horiz;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  undefined2 in_stack_fffffffffffff878;
  undefined4 uVar42;
  InterpFilterParams *in_stack_fffffffffffff888;
  undefined8 uStack_770;
  undefined8 local_758;
  undefined8 uStack_750;
  longlong local_728 [2];
  longlong local_718 [2];
  undefined2 local_708;
  undefined2 uStack_706;
  undefined2 uStack_704;
  undefined2 uStack_702;
  undefined2 uStack_700;
  undefined2 uStack_6fe;
  undefined2 uStack_6fc;
  undefined2 uStack_6fa;
  undefined2 local_6f8;
  undefined2 uStack_6f6;
  undefined2 uStack_6f4;
  undefined2 uStack_6f2;
  undefined2 uStack_6f0;
  undefined2 uStack_6ee;
  undefined2 uStack_6ec;
  undefined2 uStack_6ea;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_6c8;
  int iStack_6c4;
  int iStack_6c0;
  int iStack_6bc;
  undefined1 local_6b8 [16];
  ushort local_6a8;
  ushort uStack_6a6;
  ushort uStack_6a4;
  ushort uStack_6a2;
  ushort uStack_6a0;
  ushort uStack_69e;
  ushort uStack_69c;
  ushort uStack_69a;
  undefined1 local_698 [16];
  longlong local_678 [2];
  undefined2 local_668;
  undefined2 uStack_666;
  undefined2 uStack_664;
  undefined2 uStack_662;
  undefined2 uStack_660;
  undefined2 uStack_65e;
  undefined2 uStack_65c;
  undefined2 uStack_65a;
  undefined8 local_658;
  undefined8 uStack_650;
  int local_648;
  int iStack_644;
  int iStack_640;
  int iStack_63c;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  longlong local_5f8;
  longlong lStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  longlong local_5d8;
  longlong lStack_5d0;
  int local_5bc;
  longlong local_5b8;
  longlong lStack_5b0;
  int local_5a0;
  int local_59c;
  ulong local_598;
  undefined8 uStack_590;
  ulong local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  longlong local_558;
  longlong lStack_550;
  longlong local_548;
  longlong lStack_540;
  int local_538;
  int local_534;
  int local_530;
  int local_52c;
  longlong local_528 [8];
  __m128i local_4e8;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  int local_49c;
  int local_498;
  uint local_494;
  long local_490;
  int local_488;
  int local_484;
  long local_480;
  int local_474;
  int local_470;
  int local_46c;
  long local_468;
  int local_45c;
  int local_44c;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  undefined1 local_438 [16];
  uint local_41c;
  undefined1 local_418 [16];
  uint local_400;
  undefined2 local_3fa;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e0;
  undefined1 (*local_3d8) [16];
  __m128i *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  ulong local_328;
  undefined8 uStack_320;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  ulong local_308;
  undefined8 uStack_300;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  longlong local_2e8;
  longlong lStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  longlong local_a8;
  longlong lStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  longlong local_68;
  longlong lStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_480 = *(long *)(in_stack_00000018 + 2);
  local_484 = in_stack_00000018[4];
  local_488 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
  local_490 = in_RDI + (long)local_488 * -2;
  local_494 = 7 - in_stack_00000018[6];
  local_52c = *in_stack_00000018;
  local_530 = in_stack_00000018[9];
  local_534 = in_stack_00000018[10];
  local_538 = in_stack_00000018[0xb];
  local_548 = CONCAT44(local_534,local_534);
  lStack_540 = CONCAT44(local_534,local_534);
  local_558 = CONCAT44(local_538,local_538);
  lStack_550 = CONCAT44(local_538,local_538);
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_568 = 0;
  uStack_560 = 0;
  local_444 = (1 << (*(byte *)(in_stack_00000018 + 5) & 0x1f)) >> 1;
  local_578 = CONCAT44(local_444,local_444);
  uStack_570 = CONCAT44(local_444,local_444);
  local_400 = in_stack_00000018[5];
  local_418._4_4_ = 0;
  local_418._0_4_ = local_400;
  local_588 = local_418._0_8_;
  uStack_580 = 0;
  local_438._4_4_ = 0;
  local_438._0_4_ = local_494;
  local_598 = local_438._0_8_;
  uStack_590 = 0;
  local_59c = (((int)res_16b_3[0] - in_stack_00000018[5]) - in_stack_00000018[6]) + 0xe;
  iVar37 = 1 << ((byte)local_59c & 0x1f);
  local_5a0 = iVar37 + (1 << ((byte)local_59c - 1 & 0x1f));
  local_5b8 = CONCAT44(local_5a0,local_5a0);
  lStack_5b0 = CONCAT44(local_5a0,local_5a0);
  local_5bc = 0xe - (in_stack_00000018[5] + in_stack_00000018[6]);
  local_44c = (1 << ((byte)local_5bc & 0x1f)) >> 1;
  local_5d8 = CONCAT44(local_44c,local_44c);
  lStack_5d0 = CONCAT44(local_44c,local_44c);
  if ((int)res_16b_3[0] == 10) {
    uVar42 = 0x3ff;
  }
  else {
    uVar42 = 0xff;
    if ((int)res_16b_3[0] == 0xc) {
      uVar42 = 0xfff;
    }
  }
  local_3fa = (undefined2)uVar42;
  local_5e8 = CONCAT26(local_3fa,CONCAT24(local_3fa,CONCAT22(local_3fa,local_3fa)));
  uStack_5e0 = CONCAT26(local_3fa,CONCAT24(local_3fa,CONCAT22(local_3fa,local_3fa)));
  local_474 = in_R9D;
  local_470 = in_R8D;
  local_46c = in_ECX;
  local_468 = in_RDX;
  local_45c = in_ESI;
  local_448 = local_5a0;
  local_440 = local_538;
  local_43c = local_534;
  local_438 = ZEXT416(local_494);
  local_41c = local_494;
  local_418 = ZEXT416(local_400);
  local_c8 = local_548;
  lStack_c0 = lStack_540;
  local_b8 = local_534;
  local_b4 = local_534;
  local_b0 = local_534;
  local_ac = local_534;
  local_a8 = local_558;
  lStack_a0 = lStack_550;
  local_98 = local_538;
  local_94 = local_538;
  local_90 = local_538;
  local_8c = local_538;
  local_88 = local_578;
  uStack_80 = uStack_570;
  local_78 = local_444;
  local_74 = local_444;
  local_70 = local_444;
  local_6c = local_444;
  local_68 = local_5b8;
  lStack_60 = lStack_5b0;
  local_58 = local_5a0;
  local_54 = local_5a0;
  local_50 = local_5a0;
  local_4c = local_5a0;
  local_48 = local_5d8;
  lStack_40 = lStack_5d0;
  local_38 = local_44c;
  local_34 = local_44c;
  local_30 = local_44c;
  local_2c = local_44c;
  local_28 = local_5e8;
  uStack_20 = uStack_5e0;
  local_10 = local_3fa;
  local_e = local_3fa;
  local_c = local_3fa;
  local_a = local_3fa;
  local_8 = local_3fa;
  local_6 = local_3fa;
  local_4 = local_3fa;
  local_2 = local_3fa;
  prepare_coeffs(in_stack_fffffffffffff888,iVar37,
                 (__m128i *)CONCAT44(uVar42,CONCAT22(local_3fa,in_stack_fffffffffffff878)));
  for (local_49c = 0; local_49c < local_470; local_49c = local_49c + 8) {
    for (local_498 = 0; local_498 < local_474; local_498 = local_498 + 1) {
      local_3d0 = (__m128i *)(local_490 + (long)(local_498 * local_45c + local_49c) * 2);
      local_5f8 = (*local_3d0)[0];
      lStack_5f0 = (*local_3d0)[1];
      local_4e8 = *local_3d0;
      local_3d8 = (undefined1 (*) [16])
                  (local_490 + (long)(local_49c + 8 + local_498 * local_45c) * 2);
      local_608 = *(undefined8 *)*local_3d8;
      uStack_600 = *(undefined8 *)(*local_3d8 + 8);
      auVar1._16_16_ = *local_3d8;
      auVar1._0_16_ = (undefined1  [16])*local_3d0;
      local_4d8 = auVar1._4_16_;
      local_4c8._8_8_ = lStack_5f0;
      auVar2._16_16_ = *local_3d8;
      auVar2._0_16_ = (undefined1  [16])*local_3d0;
      local_4b8 = auVar2._12_16_;
      convolve(&local_4e8,(__m128i *)local_528);
      local_288 = local_578;
      uVar25 = local_288;
      uStack_280 = uStack_570;
      uVar30 = uStack_280;
      local_278 = (int)extraout_XMM0_Qa;
      iStack_274 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
      iStack_270 = (int)extraout_XMM0_Qb;
      iStack_26c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
      local_288._0_4_ = (int)local_578;
      local_288._4_4_ = (int)((ulong)local_578 >> 0x20);
      uStack_280._0_4_ = (int)uStack_570;
      uStack_280._4_4_ = (int)((ulong)uStack_570 >> 0x20);
      local_2f8 = local_278 + (int)local_288;
      iStack_2f4 = iStack_274 + local_288._4_4_;
      iStack_2f0 = iStack_270 + (int)uStack_280;
      iStack_2ec = iStack_26c + uStack_280._4_4_;
      local_308 = local_588;
      uStack_300 = uStack_580;
      auVar15._8_8_ = uStack_580;
      auVar15._0_8_ = local_588;
      local_618 = CONCAT44(iStack_2f4 >> auVar15,local_2f8 >> auVar15);
      uStack_610 = CONCAT44(iStack_2ec >> auVar15,iStack_2f0 >> auVar15);
      auVar3._24_8_ = uStack_600;
      auVar3._16_8_ = local_608;
      auVar3._8_8_ = lStack_5f0;
      auVar3._0_8_ = local_5f8;
      local_4e8 = auVar3._2_16_;
      auVar4._24_8_ = uStack_600;
      auVar4._16_8_ = local_608;
      auVar4._8_8_ = lStack_5f0;
      auVar4._0_8_ = local_5f8;
      local_4d8 = auVar4._6_16_;
      auVar5._24_8_ = uStack_600;
      auVar5._16_8_ = local_608;
      auVar5._8_8_ = lStack_5f0;
      auVar5._0_8_ = local_5f8;
      local_4c8 = auVar5._10_16_;
      auVar6._24_8_ = uStack_600;
      auVar6._16_8_ = local_608;
      auVar6._8_8_ = lStack_5f0;
      auVar6._0_8_ = local_5f8;
      local_4b8 = auVar6._14_16_;
      local_288 = uVar25;
      uStack_280 = uVar30;
      convolve(&local_4e8,(__m128i *)local_528);
      uVar25 = local_3a8;
      local_2a8 = local_578;
      uVar35 = local_2a8;
      uStack_2a0 = uStack_570;
      uVar36 = uStack_2a0;
      local_298 = (int)extraout_XMM0_Qa_00;
      iStack_294 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      iStack_290 = (int)extraout_XMM0_Qb_00;
      iStack_28c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      local_2a8._0_4_ = (int)local_578;
      local_2a8._4_4_ = (int)((ulong)local_578 >> 0x20);
      uStack_2a0._0_4_ = (int)uStack_570;
      uStack_2a0._4_4_ = (int)((ulong)uStack_570 >> 0x20);
      local_318 = local_298 + (int)local_2a8;
      iStack_314 = iStack_294 + local_2a8._4_4_;
      iStack_310 = iStack_290 + (int)uStack_2a0;
      iStack_30c = iStack_28c + uStack_2a0._4_4_;
      local_328 = local_588;
      uStack_320 = uStack_580;
      auVar38._8_8_ = uStack_580;
      auVar38._0_8_ = local_588;
      local_628 = CONCAT44(iStack_314 >> auVar38,local_318 >> auVar38);
      uStack_620 = CONCAT44(iStack_30c >> auVar38,iStack_310 >> auVar38);
      local_338 = local_618;
      uVar31 = local_338;
      uStack_330 = uStack_610;
      uVar32 = uStack_330;
      local_348 = local_598;
      uVar29 = local_348;
      uStack_340 = uStack_590;
      uVar30 = uStack_340;
      local_338._0_4_ = (int)local_618;
      local_338._4_4_ = (int)((ulong)local_618 >> 0x20);
      uStack_330._0_4_ = (int)uStack_610;
      uStack_330._4_4_ = (int)((ulong)uStack_610 >> 0x20);
      local_348._0_4_ = (int)local_598;
      local_348._4_4_ = (int)(local_598 >> 0x20);
      uStack_340._0_4_ = (int)uStack_590;
      uStack_340._4_4_ = (int)((ulong)uStack_590 >> 0x20);
      local_638 = (int)local_338 << (int)local_348;
      iStack_630 = local_338._4_4_ << local_348._4_4_;
      iVar37 = (int)uStack_330 << (int)uStack_340;
      iVar40 = uStack_330._4_4_ << uStack_340._4_4_;
      local_618 = CONCAT44(iStack_630,local_638);
      uStack_610 = CONCAT44(iVar40,iVar37);
      local_358 = local_628;
      uStack_350 = uStack_620;
      local_368 = local_598;
      uStack_360 = uStack_590;
      iStack_634 = (local_318 >> auVar38) << (int)local_348;
      iStack_62c = (iStack_314 >> auVar38) << local_348._4_4_;
      iVar39 = (iStack_310 >> auVar38) << (int)uStack_340;
      iVar41 = (iStack_30c >> auVar38) << uStack_340._4_4_;
      local_628 = CONCAT44(iStack_62c,iStack_634);
      uStack_620 = CONCAT44(iVar41,iVar39);
      local_f8 = local_618;
      uStack_f0 = uStack_610;
      local_108 = local_628;
      uStack_100 = uStack_620;
      local_2b8 = CONCAT44(iStack_634,local_638);
      uStack_2b0 = CONCAT44(iStack_62c,iStack_630);
      local_2c8 = local_5b8;
      lVar33 = local_2c8;
      uStack_2c0 = lStack_5b0;
      lVar34 = uStack_2c0;
      local_2c8._0_4_ = (int)local_5b8;
      local_2c8._4_4_ = (int)((ulong)local_5b8 >> 0x20);
      uStack_2c0._0_4_ = (int)lStack_5b0;
      uStack_2c0._4_4_ = (int)((ulong)lStack_5b0 >> 0x20);
      local_648 = local_638 + (int)local_2c8;
      iStack_644 = iStack_634 + local_2c8._4_4_;
      iStack_640 = iStack_630 + (int)uStack_2c0;
      iStack_63c = iStack_62c + uStack_2c0._4_4_;
      local_3a8._0_2_ = (undefined2)local_568;
      uVar24 = (undefined2)local_3a8;
      local_3a8._2_2_ = (undefined2)((ulong)local_568 >> 0x10);
      uVar26 = local_3a8._2_2_;
      local_3a8._4_2_ = (undefined2)((ulong)local_568 >> 0x20);
      uVar27 = local_3a8._4_2_;
      local_3a8._6_2_ = (undefined2)((ulong)local_568 >> 0x30);
      uVar28 = local_3a8._6_2_;
      local_3a8 = uVar25;
      local_348 = uVar29;
      uStack_340 = uVar30;
      local_338 = uVar31;
      uStack_330 = uVar32;
      local_2c8 = lVar33;
      uStack_2c0 = lVar34;
      local_2a8 = uVar35;
      uStack_2a0 = uVar36;
      if (local_470 - local_49c < 8) {
        if (local_52c == 0) {
          local_208 = CONCAT44(iStack_644,local_648);
          uStack_200 = CONCAT44(iStack_63c,iStack_640);
          auVar21._8_8_ = uStack_200;
          auVar21._0_8_ = local_208;
          auVar20._8_8_ = uStack_200;
          auVar20._0_8_ = local_208;
          local_6b8 = packusdw(auVar21,auVar20);
          local_170 = (undefined8 *)(local_480 + (long)(local_498 * local_484 + local_49c) * 2);
          local_188 = local_6b8._0_8_;
          uStack_180 = local_6b8._8_8_;
          *local_170 = local_6b8._0_8_;
          local_1f8 = local_208;
          uStack_1f0 = uStack_200;
        }
        else {
          local_250 = (undefined8 *)(local_480 + (long)(local_498 * local_484 + local_49c) * 2);
          local_658 = *local_250;
          uStack_260 = 0;
          uStack_650 = 0;
          uStack_390 = 0;
          local_3a8 = local_568;
          uStack_3a0 = uStack_560;
          local_398._0_2_ = (undefined2)local_658;
          local_398._2_2_ = (undefined2)((ulong)local_658 >> 0x10);
          local_398._4_2_ = (undefined2)((ulong)local_658 >> 0x20);
          local_398._6_2_ = (undefined2)((ulong)local_658 >> 0x30);
          local_668 = (undefined2)local_398;
          uStack_666 = uVar24;
          uStack_664 = local_398._2_2_;
          uStack_662 = uVar26;
          uStack_660 = local_398._4_2_;
          uStack_65e = uVar27;
          uStack_65c = local_398._6_2_;
          uStack_65a = uVar28;
          local_398 = local_658;
          local_268 = local_658;
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_668,(__m128i *)&local_648,(__m128i *)&local_548,
                     (__m128i *)&local_558,local_530);
          highbd_convolve_rounding_sse2
                    (&local_678,(__m128i *)&local_5b8,(__m128i *)&local_5d8,local_5bc);
          auVar23._8_8_ = extraout_XMM0_Qb_01;
          auVar23._0_8_ = extraout_XMM0_Qa_01;
          auVar22._8_8_ = extraout_XMM0_Qb_01;
          auVar22._0_8_ = extraout_XMM0_Qa_01;
          local_698 = packusdw(auVar23,auVar22);
          local_198 = local_698._0_8_;
          uVar25 = local_198;
          uStack_190 = local_698._8_8_;
          uVar30 = uStack_190;
          local_1a8 = local_5e8;
          uStack_1a0 = uStack_5e0;
          local_198._0_2_ = local_698._0_2_;
          local_198._2_2_ = local_698._2_2_;
          local_198._4_2_ = local_698._4_2_;
          local_198._6_2_ = local_698._6_2_;
          uStack_190._0_2_ = local_698._8_2_;
          uStack_190._2_2_ = local_698._10_2_;
          uStack_190._4_2_ = local_698._12_2_;
          uStack_190._6_2_ = local_698._14_2_;
          sVar7 = (short)local_5e8;
          local_6a8 = (ushort)(sVar7 < (short)local_198) * sVar7 |
                      (ushort)(sVar7 >= (short)local_198) * (short)local_198;
          sVar7 = (short)((ulong)local_5e8 >> 0x10);
          uStack_6a6 = (ushort)(sVar7 < local_198._2_2_) * sVar7 |
                       (ushort)(sVar7 >= local_198._2_2_) * local_198._2_2_;
          sVar7 = (short)((ulong)local_5e8 >> 0x20);
          uStack_6a4 = (ushort)(sVar7 < local_198._4_2_) * sVar7 |
                       (ushort)(sVar7 >= local_198._4_2_) * local_198._4_2_;
          sVar7 = (short)((ulong)local_5e8 >> 0x30);
          uStack_6a2 = (ushort)(sVar7 < local_198._6_2_) * sVar7 |
                       (ushort)(sVar7 >= local_198._6_2_) * local_198._6_2_;
          sVar7 = (short)uStack_5e0;
          uStack_6a0 = (ushort)(sVar7 < (short)uStack_190) * sVar7 |
                       (ushort)(sVar7 >= (short)uStack_190) * (short)uStack_190;
          sVar7 = (short)((ulong)uStack_5e0 >> 0x10);
          uStack_69e = (ushort)(sVar7 < uStack_190._2_2_) * sVar7 |
                       (ushort)(sVar7 >= uStack_190._2_2_) * uStack_190._2_2_;
          sVar7 = (short)((ulong)uStack_5e0 >> 0x20);
          uStack_69c = (ushort)(sVar7 < uStack_190._4_2_) * sVar7 |
                       (ushort)(sVar7 >= uStack_190._4_2_) * uStack_190._4_2_;
          sVar7 = (short)((ulong)uStack_5e0 >> 0x30);
          uStack_69a = (ushort)(sVar7 < uStack_190._6_2_) * sVar7 |
                       (ushort)(sVar7 >= uStack_190._6_2_) * uStack_190._6_2_;
          local_150 = (undefined8 *)(local_468 + (long)(local_498 * local_46c + local_49c) * 2);
          local_168 = CONCAT26(uStack_6a2,CONCAT24(uStack_6a4,CONCAT22(uStack_6a6,local_6a8)));
          uStack_160 = CONCAT26(uStack_69a,CONCAT24(uStack_69c,CONCAT22(uStack_69e,uStack_6a0)));
          *local_150 = local_168;
          local_198 = uVar25;
          uStack_190 = uVar30;
        }
      }
      else {
        local_d8 = local_618;
        uStack_d0 = uStack_610;
        local_e8 = local_628;
        uStack_e0 = uStack_620;
        local_2d8 = CONCAT44(iVar39,iVar37);
        uStack_2d0 = CONCAT44(iVar41,iVar40);
        local_2e8 = local_5b8;
        lStack_2e0 = lStack_5b0;
        local_6d8 = iVar37 + (int)local_2c8;
        iStack_6d4 = iVar39 + local_2c8._4_4_;
        iStack_6d0 = iVar40 + (int)uStack_2c0;
        iStack_6cc = iVar41 + uStack_2c0._4_4_;
        local_6c8 = iVar37;
        iStack_6c4 = iVar39;
        iStack_6c0 = iVar40;
        iStack_6bc = iVar41;
        if (local_52c == 0) {
          local_238 = CONCAT44(iStack_644,local_648);
          uStack_230 = CONCAT44(iStack_63c,iStack_640);
          local_248 = CONCAT44(iStack_6d4,local_6d8);
          uStack_240 = CONCAT44(iStack_6cc,iStack_6d0);
          auVar17._8_8_ = uStack_230;
          auVar17._0_8_ = local_238;
          auVar16._8_8_ = uStack_240;
          auVar16._0_8_ = local_248;
          auVar38 = packusdw(auVar17,auVar16);
          local_130 = (undefined8 *)(local_480 + (long)(local_498 * local_484 + local_49c) * 2);
          local_148 = auVar38._0_8_;
          uStack_770 = auVar38._8_8_;
          uStack_140 = uStack_770;
          *local_130 = local_148;
          local_130[1] = uStack_770;
        }
        else {
          local_3e0 = (undefined8 *)(local_480 + (long)(local_498 * local_484 + local_49c) * 2);
          local_6e8 = *local_3e0;
          uStack_6e0 = local_3e0[1];
          local_3c8 = local_568;
          uStack_3c0 = uStack_560;
          local_3b8._0_2_ = (undefined2)local_6e8;
          local_3b8._2_2_ = (undefined2)((ulong)local_6e8 >> 0x10);
          local_3b8._4_2_ = (undefined2)((ulong)local_6e8 >> 0x20);
          local_3b8._6_2_ = (undefined2)((ulong)local_6e8 >> 0x30);
          local_6f8 = (undefined2)local_3b8;
          uStack_6f6 = (undefined2)local_3a8;
          uStack_6f4 = local_3b8._2_2_;
          uStack_6f2 = local_3a8._2_2_;
          uStack_6f0 = local_3b8._4_2_;
          uStack_6ee = local_3a8._4_2_;
          uStack_6ec = local_3b8._6_2_;
          uStack_6ea = local_3a8._6_2_;
          local_388 = local_568;
          uStack_380 = uStack_560;
          uVar25 = uStack_380;
          uStack_370._0_2_ = (undefined2)uStack_6e0;
          uStack_370._2_2_ = (undefined2)((ulong)uStack_6e0 >> 0x10);
          uStack_370._4_2_ = (undefined2)((ulong)uStack_6e0 >> 0x20);
          uStack_370._6_2_ = (undefined2)((ulong)uStack_6e0 >> 0x30);
          uStack_380._0_2_ = (undefined2)uStack_560;
          uStack_380._2_2_ = (undefined2)((ulong)uStack_560 >> 0x10);
          uStack_380._4_2_ = (undefined2)((ulong)uStack_560 >> 0x20);
          uStack_380._6_2_ = (undefined2)((ulong)uStack_560 >> 0x30);
          local_708 = (undefined2)uStack_370;
          uStack_706 = (undefined2)uStack_380;
          uStack_704 = uStack_370._2_2_;
          uStack_702 = uStack_380._2_2_;
          uStack_700 = uStack_370._4_2_;
          uStack_6fe = uStack_380._4_2_;
          uStack_6fc = uStack_370._6_2_;
          uStack_6fa = uStack_380._6_2_;
          local_3b8 = local_6e8;
          uStack_3b0 = uStack_6e0;
          uStack_380 = uVar25;
          local_378 = local_6e8;
          uStack_370 = uStack_6e0;
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_6f8,(__m128i *)&local_648,(__m128i *)&local_548,
                     (__m128i *)&local_558,local_530);
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_708,(__m128i *)&local_6d8,(__m128i *)&local_548,
                     (__m128i *)&local_558,local_530);
          highbd_convolve_rounding_sse2
                    (&local_718,(__m128i *)&local_5b8,(__m128i *)&local_5d8,local_5bc);
          highbd_convolve_rounding_sse2
                    (&local_728,(__m128i *)&local_5b8,(__m128i *)&local_5d8,local_5bc);
          auVar19._8_8_ = extraout_XMM0_Qb_02;
          auVar19._0_8_ = extraout_XMM0_Qa_02;
          auVar18._8_8_ = extraout_XMM0_Qb_03;
          auVar18._0_8_ = extraout_XMM0_Qa_03;
          auVar38 = packusdw(auVar19,auVar18);
          local_758 = auVar38._0_8_;
          uStack_750 = auVar38._8_8_;
          local_1b8 = local_758;
          uVar25 = local_1b8;
          uStack_1b0 = uStack_750;
          uVar30 = uStack_1b0;
          local_1c8 = local_5e8;
          uStack_1c0 = uStack_5e0;
          local_1b8._0_2_ = auVar38._0_2_;
          local_1b8._2_2_ = auVar38._2_2_;
          local_1b8._4_2_ = auVar38._4_2_;
          local_1b8._6_2_ = auVar38._6_2_;
          uStack_1b0._0_2_ = auVar38._8_2_;
          uStack_1b0._2_2_ = auVar38._10_2_;
          uStack_1b0._4_2_ = auVar38._12_2_;
          uStack_1b0._6_2_ = auVar38._14_2_;
          sVar7 = (short)local_5e8;
          sVar8 = (short)((ulong)local_5e8 >> 0x10);
          sVar9 = (short)((ulong)local_5e8 >> 0x20);
          sVar10 = (short)((ulong)local_5e8 >> 0x30);
          sVar11 = (short)uStack_5e0;
          sVar12 = (short)((ulong)uStack_5e0 >> 0x10);
          sVar13 = (short)((ulong)uStack_5e0 >> 0x20);
          sVar14 = (short)((ulong)uStack_5e0 >> 0x30);
          local_110 = (undefined8 *)(local_468 + (long)(local_498 * local_46c + local_49c) * 2);
          local_128 = CONCAT26((ushort)(sVar10 < local_1b8._6_2_) * sVar10 |
                               (ushort)(sVar10 >= local_1b8._6_2_) * local_1b8._6_2_,
                               CONCAT24((ushort)(sVar9 < local_1b8._4_2_) * sVar9 |
                                        (ushort)(sVar9 >= local_1b8._4_2_) * local_1b8._4_2_,
                                        CONCAT22((ushort)(sVar8 < local_1b8._2_2_) * sVar8 |
                                                 (ushort)(sVar8 >= local_1b8._2_2_) *
                                                 local_1b8._2_2_,
                                                 (ushort)(sVar7 < (short)local_1b8) * sVar7 |
                                                 (ushort)(sVar7 >= (short)local_1b8) *
                                                 (short)local_1b8)));
          uStack_120 = CONCAT26((ushort)(sVar14 < uStack_1b0._6_2_) * sVar14 |
                                (ushort)(sVar14 >= uStack_1b0._6_2_) * uStack_1b0._6_2_,
                                CONCAT24((ushort)(sVar13 < uStack_1b0._4_2_) * sVar13 |
                                         (ushort)(sVar13 >= uStack_1b0._4_2_) * uStack_1b0._4_2_,
                                         CONCAT22((ushort)(sVar12 < uStack_1b0._2_2_) * sVar12 |
                                                  (ushort)(sVar12 >= uStack_1b0._2_2_) *
                                                  uStack_1b0._2_2_,
                                                  (ushort)(sVar11 < (short)uStack_1b0) * sVar11 |
                                                  (ushort)(sVar11 >= (short)uStack_1b0) *
                                                  (short)uStack_1b0)));
          *local_110 = local_128;
          local_110[1] = uStack_120;
          local_1b8 = uVar25;
          uStack_1b0 = uVar30;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m128i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 1) {
      const __m128i row00 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
      const __m128i row01 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

      // even pixels
      s[0] = _mm_alignr_epi8(row01, row00, 0);
      s[1] = _mm_alignr_epi8(row01, row00, 4);
      s[2] = _mm_alignr_epi8(row01, row00, 8);
      s[3] = _mm_alignr_epi8(row01, row00, 12);

      __m128i res_even = convolve(s, coeffs_x);
      res_even =
          _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x), round_shift_x);

      // odd pixels
      s[0] = _mm_alignr_epi8(row01, row00, 2);
      s[1] = _mm_alignr_epi8(row01, row00, 6);
      s[2] = _mm_alignr_epi8(row01, row00, 10);
      s[3] = _mm_alignr_epi8(row01, row00, 14);

      __m128i res_odd = convolve(s, coeffs_x);
      res_odd =
          _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x), round_shift_x);

      res_even = _mm_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm_sll_epi32(res_odd, round_shift_bits);

      __m128i res1 = _mm_unpacklo_epi32(res_even, res_odd);
      __m128i res_unsigned_lo = _mm_add_epi32(res1, offset_const);
      if (w - j < 8) {
        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);

          const __m128i comp_avg_res = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i round_result = highbd_convolve_rounding_sse2(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b = _mm_packus_epi32(round_result, round_result);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b);
        }
      } else {
        __m128i res2 = _mm_unpackhi_epi32(res_even, res_odd);
        __m128i res_unsigned_hi = _mm_add_epi32(res2, offset_const);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
        }
      }
    }
  }
}